

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deformableconv2d_x86_avx.cpp
# Opt level: O3

void __thiscall
ncnn::DeformableConv2D_x86_avx::DeformableConv2D_x86_avx(DeformableConv2D_x86_avx *this,void **vtt)

{
  _func_int **pp_Var1;
  
  pp_Var1 = (_func_int **)*vtt;
  this->_vptr_DeformableConv2D_x86_avx = pp_Var1;
  *(void **)((long)&this->_vptr_DeformableConv2D_x86_avx + (long)pp_Var1[-3]) = vtt[1];
  (this->weight_data_t).cstep = 0;
  (this->weight_data_t).data = (void *)0x0;
  (this->weight_data_t).refcount = (int *)0x0;
  *(undefined8 *)((long)&(this->weight_data_t).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->weight_data_t).elemsize + 4) = 0;
  (this->weight_data_t).allocator = (Allocator *)0x0;
  (this->weight_data_t).dims = 0;
  (this->weight_data_t).w = 0;
  (this->weight_data_t).w = 0;
  (this->weight_data_t).h = 0;
  (this->weight_data_t).d = 0;
  (this->weight_data_t).c = 0;
  pp_Var1 = this->_vptr_DeformableConv2D_x86_avx;
  pp_Var1[-3][(long)&(this->weight_data_t).data] = (_func_int)0x0;
  (pp_Var1[-3] + 1)[(long)&(this->weight_data_t).data] = (code)0x0;
  this->inner_product = (Layer *)0x0;
  this->permute = (Layer *)0x0;
  return;
}

Assistant:

DeformableConv2D_x86_avx::DeformableConv2D_x86_avx()
{
    one_blob_only = false;
    support_inplace = false;

    inner_product = 0;
    permute = 0;
}